

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<FSplashDef,_FSplashDef>::Push(TArray<FSplashDef,_FSplashDef> *this,FSplashDef *item)

{
  uint uVar1;
  FSplashDef *pFVar2;
  PClassActor *pPVar3;
  PClassActor *pPVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  FSoundID FVar8;
  
  Grow(this,1);
  pFVar2 = this->Array;
  uVar1 = this->Count;
  FVar8.ID = (item->SmallSplashSound).ID;
  pFVar2[uVar1].Name = (FName)(item->Name).Index;
  pFVar2[uVar1].SmallSplashSound = (FSoundID)FVar8.ID;
  pFVar2[uVar1].NormalSplashSound.ID = (item->NormalSplashSound).ID;
  pPVar3 = item->SplashBase;
  pPVar4 = item->SplashChunk;
  uVar5 = *(undefined8 *)&item->ChunkXVelShift;
  dVar6 = item->ChunkBaseZVel;
  dVar7 = item->SmallSplashClip;
  pFVar2[uVar1].SmallSplash = item->SmallSplash;
  (&pFVar2[uVar1].SmallSplash)[1] = pPVar3;
  pFVar2[uVar1].SplashChunk = pPVar4;
  (&pFVar2[uVar1].SplashChunk)[1] = (PClassActor *)uVar5;
  pFVar2[uVar1].ChunkBaseZVel = dVar6;
  (&pFVar2[uVar1].ChunkBaseZVel)[1] = dVar7;
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}